

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_unittest.cc
# Opt level: O2

void __thiscall
Test_Demangle_CornerCases::Test_Demangle_CornerCases(Test_Demangle_CornerCases *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  ___std__vector<void(*)(),std::allocator<void(*)()>>__emplace_back<void(*)()>_void_________
            (&google::g_testlist,&local_8);
  return;
}

Assistant:

TEST(Demangle, CornerCases) {
  const size_t size = 10;
  char tmp[size] = { 0 };
  const char *demangled = "foobar()";
  const char *mangled = "_Z6foobarv";
  EXPECT_TRUE(Demangle(mangled, tmp, sizeof(tmp)));
  // sizeof("foobar()") == size - 1
  EXPECT_STREQ(demangled, tmp);
  EXPECT_TRUE(Demangle(mangled, tmp, size - 1));
  EXPECT_STREQ(demangled, tmp);
  EXPECT_FALSE(Demangle(mangled, tmp, size - 2));  // Not enough.
  EXPECT_FALSE(Demangle(mangled, tmp, 1));
  EXPECT_FALSE(Demangle(mangled, tmp, 0));
  EXPECT_FALSE(Demangle(mangled, NULL, 0));  // Should not cause SEGV.
}